

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-avl.c
# Opt level: O2

void pp_tree_avl_rotate_right_left(PTreeAVLNode *node,PTreeBaseNode **root)

{
  PTreeAVLNode_ *pPVar1;
  PTreeBaseNode_ *pPVar2;
  PTreeAVLNode_ *pPVar3;
  PTreeAVLNode_ *pPVar4;
  pint pVar5;
  pint pVar6;
  
  pPVar1 = (PTreeAVLNode_ *)(node->base).left;
  pPVar2 = (pPVar1->base).right;
  (node->base).left = pPVar2;
  if (pPVar2 != (PTreeBaseNode_ *)0x0) {
    pPVar2[1].left = &node->base;
  }
  pPVar3 = node->parent->parent;
  pPVar1->parent = pPVar3;
  if (pPVar3 == (PTreeAVLNode_ *)0x0) {
    *root = (PTreeBaseNode *)pPVar1;
    pPVar4 = node->parent;
  }
  else {
    pPVar4 = node->parent;
    if ((PTreeAVLNode_ *)(pPVar3->base).left == pPVar4) {
      (pPVar3->base).left = (PTreeBaseNode_ *)pPVar1;
    }
    else {
      (pPVar3->base).right = (PTreeBaseNode_ *)pPVar1;
    }
  }
  pPVar2 = (pPVar1->base).left;
  (pPVar4->base).right = pPVar2;
  if (pPVar2 != (PTreeBaseNode_ *)0x0) {
    pPVar2[1].left = &pPVar4->base;
    pPVar4 = node->parent;
  }
  (pPVar1->base).left = &pPVar4->base;
  pPVar4->parent = pPVar1;
  (pPVar1->base).right = &node->base;
  node->parent = pPVar1;
  if (pPVar1->balance_factor == 1) {
    pVar5 = -1;
    pVar6 = 0;
  }
  else if (pPVar1->balance_factor == -1) {
    pVar5 = 0;
    pVar6 = 1;
  }
  else {
    pVar6 = 0;
    pVar5 = 0;
  }
  pPVar4->balance_factor = pVar6;
  node->balance_factor = pVar5;
  pPVar1->balance_factor = 0;
  return;
}

Assistant:

static void
pp_tree_avl_rotate_right_left (PTreeAVLNode *node, PTreeBaseNode **root)
{
	PTreeAVLNode *tmp_node;

	tmp_node = (PTreeAVLNode *) node->base.left;
	node->base.left = tmp_node->base.right;

	if (node->base.left != NULL)
		((PTreeAVLNode *) node->base.left)->parent = node;

	tmp_node->parent = node->parent->parent;

	if (P_LIKELY (tmp_node->parent != NULL)) {
		if (tmp_node->parent->base.left == (PTreeBaseNode *) node->parent)
			tmp_node->parent->base.left = (PTreeBaseNode *) tmp_node;
		else
			tmp_node->parent->base.right = (PTreeBaseNode *) tmp_node;
	} else
		*root = (PTreeBaseNode *) tmp_node;

	node->parent->base.right = tmp_node->base.left;

	if (node->parent->base.right != NULL)
		((PTreeAVLNode *) node->parent->base.right)->parent = node->parent;

	tmp_node->base.left = (PTreeBaseNode *) node->parent;
	((PTreeAVLNode *) tmp_node->base.left)->parent = tmp_node;

	tmp_node->base.right = (PTreeBaseNode *) node;
	node->parent = tmp_node;

	/* Restore balance factor */
	if (tmp_node->balance_factor == 1) {
		((PTreeAVLNode *) tmp_node->base.left)->balance_factor  = 0;
		((PTreeAVLNode *) tmp_node->base.right)->balance_factor = -1;
	} else if (tmp_node->balance_factor == -1) {
		((PTreeAVLNode *) tmp_node->base.left)->balance_factor  = 1;
		((PTreeAVLNode *) tmp_node->base.right)->balance_factor = 0;
	} else {
		((PTreeAVLNode *) tmp_node->base.left)->balance_factor  = 0;
		((PTreeAVLNode *) tmp_node->base.right)->balance_factor = 0;
	}

	tmp_node->balance_factor = 0;
}